

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O0

void Iex_3_4::setFpExceptionHandler(FpExceptionHandler handler)

{
  undefined8 in_RDI;
  sigaction action;
  sigaction local_a0;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if ((anonymous_namespace)::fpeHandler == 0) {
    sigemptyset(&local_a0.sa_mask);
    local_a0.sa_flags = 0x40000004;
    local_a0.__sigaction_handler.sa_handler = catchSigFpe;
    local_a0.sa_restorer = (_func_5327 *)0x0;
    sigaction(8,&local_a0,(sigaction *)0x0);
  }
  (anonymous_namespace)::fpeHandler = local_8;
  return;
}

Assistant:

void
setFpExceptionHandler (FpExceptionHandler handler)
{
    if (fpeHandler == 0)
    {
        struct sigaction action;
        sigemptyset (&action.sa_mask);
        action.sa_flags     = SA_SIGINFO | SA_NOMASK;
        action.sa_sigaction = (void (*) (int, siginfo_t*, void*)) catchSigFpe;
        action.sa_restorer  = 0;

        sigaction (SIGFPE, &action, 0);
    }

    fpeHandler = handler;
}